

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O3

int mbedtls_rsa_deduce_crt
              (mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *DP,mbedtls_mpi *DQ,
              mbedtls_mpi *QP)

{
  int iVar1;
  mbedtls_mpi K;
  mbedtls_mpi local_48;
  
  mbedtls_mpi_init(&local_48);
  if ((DP == (mbedtls_mpi *)0x0) ||
     ((iVar1 = mbedtls_mpi_sub_int(&local_48,P,1), iVar1 == 0 &&
      (iVar1 = mbedtls_mpi_mod_mpi(DP,D,&local_48), iVar1 == 0)))) {
    if (DQ == (mbedtls_mpi *)0x0) {
      if (QP == (mbedtls_mpi *)0x0) {
        iVar1 = 0;
        goto LAB_00115c04;
      }
    }
    else {
      iVar1 = mbedtls_mpi_sub_int(&local_48,Q,1);
      if ((iVar1 != 0) ||
         (iVar1 = mbedtls_mpi_mod_mpi(DQ,D,&local_48), QP == (mbedtls_mpi *)0x0 || iVar1 != 0))
      goto LAB_00115c04;
    }
    iVar1 = mbedtls_mpi_inv_mod(QP,Q,P);
  }
LAB_00115c04:
  mbedtls_mpi_free(&local_48);
  return iVar1;
}

Assistant:

int mbedtls_rsa_deduce_crt( const mbedtls_mpi *P, const mbedtls_mpi *Q,
                            const mbedtls_mpi *D, mbedtls_mpi *DP,
                            mbedtls_mpi *DQ, mbedtls_mpi *QP )
{
    int ret = 0;
    mbedtls_mpi K;
    mbedtls_mpi_init( &K );

    /* DP = D mod P-1 */
    if( DP != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, P, 1  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( DP, D, &K ) );
    }

    /* DQ = D mod Q-1 */
    if( DQ != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, Q, 1  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( DQ, D, &K ) );
    }

    /* QP = Q^{-1} mod P */
    if( QP != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( QP, Q, P ) );
    }

cleanup:
    mbedtls_mpi_free( &K );

    return( ret );
}